

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O3

SRes crnlib::LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  SRes SVar4;
  Byte *pBVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  uint local_34;
  
  SVar4 = 4;
  if (4 < propsSize) {
    uVar8 = 0x1000;
    if (0x1000 < *(uint *)(props + 1)) {
      uVar8 = *(uint *)(props + 1);
    }
    bVar1 = *props;
    if (bVar1 < 0xe1) {
      cVar3 = (char)(bVar1 / 9);
      bVar6 = bVar1 + cVar3 * -9;
      bVar2 = cVar3 + (char)((bVar1 / 9) * 0x34 >> 8) * -5;
      SVar4 = LzmaDec_AllocateProbs2
                        ((crnlib *)p,(CLzmaDec *)(ulong)bVar6,(CLzmaProps *)(ulong)bVar2,alloc);
      if (SVar4 == 0) {
        uVar7 = (ulong)uVar8;
        if ((p->dic == (Byte *)0x0) || (p->dicBufSize != uVar7)) {
          (*alloc->Free)(alloc,p->dic);
          p->dic = (Byte *)0x0;
          pBVar5 = (Byte *)(*alloc->Alloc)(alloc,uVar7);
          p->dic = pBVar5;
          if (pBVar5 == (Byte *)0x0) {
            (*alloc->Free)(alloc,p->probs);
            p->probs = (UInt16 *)0x0;
            return 2;
          }
        }
        local_34 = (uint)bVar1;
        cVar3 = (char)(local_34 * 0x6d >> 8);
        p->dicBufSize = uVar7;
        (p->prop).lc = (uint)bVar6;
        (p->prop).lp = (uint)bVar2;
        (p->prop).pb = (uint)((byte)(((byte)(bVar1 - cVar3) >> 1) + cVar3) >> 5);
        (p->prop).dicSize = uVar8;
        SVar4 = 0;
      }
    }
  }
  return SVar4;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec* p, const Byte* props, unsigned propsSize, ISzAlloc* alloc) {
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  dicBufSize = propNew.dicSize;
  if (p->dic == 0 || dicBufSize != p->dicBufSize) {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte*)alloc->Alloc(alloc, dicBufSize);
    if (p->dic == 0) {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}